

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::SatisfyMarkTempObjectsConditions(BackwardPass *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte local_11;
  BackwardPass *this_local;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MarkTempPhase,uVar2,uVar3);
  local_11 = 0;
  if (!bVar1) {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MarkTempObjectPhase,uVar2,uVar3);
    local_11 = 0;
    if (!bVar1) {
      bVar1 = Func::DoGlobOpt(this->func);
      local_11 = 0;
      if (bVar1) {
        bVar1 = Func::GetHasTempObjectProducingInstr(this->func);
        local_11 = 0;
        if (bVar1) {
          bVar1 = Func::IsJitInDebugMode(this->func);
          local_11 = bVar1 ^ 0xff;
        }
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
BackwardPass::SatisfyMarkTempObjectsConditions() const {
    return !PHASE_OFF(Js::MarkTempPhase, this->func) &&
        !PHASE_OFF(Js::MarkTempObjectPhase, this->func) &&
        func->DoGlobOpt() && func->GetHasTempObjectProducingInstr() &&
        !func->IsJitInDebugMode();

    // Why MarkTempObject is disabled under debugger:
    //   We add 'identified so far dead non-temp locals' to byteCodeUpwardExposedUsed in ProcessBailOutInfo,
    //   this may cause MarkTempObject to convert some temps back to non-temp when it sees a 'transferred exposed use'
    //   from a temp to non-temp. That's in general not a supported conversion (while non-temp -> temp is fine).
}